

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readOpcodeRegister(InternalInstruction *insn,uint8_t size)

{
  uint8_t size_local;
  InternalInstruction *insn_local;
  
  size_local = size;
  if (size == '\0') {
    size_local = insn->registerSize;
  }
  insn->operandSize = size_local;
  switch(size_local) {
  case '\x01':
    insn->opcodeRegister = (insn->rexPrefix & 1) << 3 | insn->opcode & MODRM_REG_BH;
    if (((insn->rexPrefix != '\0') && (MODRM_REG_BL < insn->opcodeRegister)) &&
       (insn->opcodeRegister < MODRM_REG_R8B)) {
      insn->opcodeRegister = insn->opcodeRegister + MODRM_REG_R12B;
    }
    break;
  case '\x02':
    insn->opcodeRegister = ((insn->rexPrefix & 1) << 3 | insn->opcode & 7) + MODRM_REG_AX;
    break;
  case '\x04':
    insn->opcodeRegister = ((insn->rexPrefix & 1) << 3 | insn->opcode & 7) + MODRM_REG_EAX;
    break;
  case '\b':
    insn->opcodeRegister = ((insn->rexPrefix & 1) << 3 | insn->opcode & 7) + MODRM_REG_RAX;
  }
  return 0;
}

Assistant:

static int readOpcodeRegister(struct InternalInstruction *insn, uint8_t size)
{
	// dbgprintf(insn, "readOpcodeRegister()");

	if (size == 0)
		size = insn->registerSize;

	insn->operandSize = size;

	switch (size) {
		case 1:
			insn->opcodeRegister = (Reg)(MODRM_REG_AL + ((bFromREX(insn->rexPrefix) << 3)
						| (insn->opcode & 7)));
			if (insn->rexPrefix &&
					insn->opcodeRegister >= MODRM_REG_AL + 0x4 &&
					insn->opcodeRegister < MODRM_REG_AL + 0x8) {
				insn->opcodeRegister = (Reg)(MODRM_REG_SPL
						+ (insn->opcodeRegister - MODRM_REG_AL - 4));
			}

			break;
		case 2:
			insn->opcodeRegister = (Reg)(MODRM_REG_AX
					+ ((bFromREX(insn->rexPrefix) << 3)
						| (insn->opcode & 7)));
			break;
		case 4:
			insn->opcodeRegister = (Reg)(MODRM_REG_EAX
					+ ((bFromREX(insn->rexPrefix) << 3)
						| (insn->opcode & 7)));
			break;
		case 8:
			insn->opcodeRegister = (Reg)(MODRM_REG_RAX
					+ ((bFromREX(insn->rexPrefix) << 3)
						| (insn->opcode & 7)));
			break;
	}

	return 0;
}